

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O0

bool __thiscall CExtKey::Derive(CExtKey *this,CExtKey *out,uint _nChild)

{
  uchar uVar1;
  long lVar2;
  uchar uVar3;
  undefined4 in_EDX;
  char *in_RSI;
  uchar *in_RDI;
  long in_FS_OFFSET;
  ChainCode *in_stack_00000030;
  uint in_stack_0000003c;
  ChainCode *in_stack_00000040;
  CKey *in_stack_00000048;
  CKey *in_stack_00000050;
  CKeyID id;
  undefined2 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa2;
  bool bVar4;
  undefined5 in_stack_ffffffffffffffa3;
  undefined4 local_1c;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = *in_RDI;
  uVar3 = std::numeric_limits<unsigned_char>::max();
  if (uVar1 == uVar3) {
    bVar4 = false;
  }
  else {
    *in_RSI = *in_RDI + '\x01';
    CKey::GetPubKey((CKey *)CONCAT53(in_stack_ffffffffffffffa3,
                                     CONCAT12(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0)))
    ;
    CPubKey::GetID((CPubKey *)
                   CONCAT53(in_stack_ffffffffffffffa3,
                            CONCAT12(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0)));
    *(undefined4 *)(in_RSI + 1) = local_1c;
    *(undefined4 *)(in_RSI + 8) = in_EDX;
    bVar4 = CKey::Derive(in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_0000003c,
                         in_stack_00000030);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool CExtKey::Derive(CExtKey &out, unsigned int _nChild) const {
    if (nDepth == std::numeric_limits<unsigned char>::max()) return false;
    out.nDepth = nDepth + 1;
    CKeyID id = key.GetPubKey().GetID();
    memcpy(out.vchFingerprint, &id, 4);
    out.nChild = _nChild;
    return key.Derive(out.key, out.chaincode, _nChild, chaincode);
}